

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphmesh.cpp
# Opt level: O0

void __thiscall
TPZGraphMesh::TPZGraphMesh
          (TPZGraphMesh *this,TPZCompMesh *cm,int dimension,
          set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalarnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames)

{
  TPZCompEl *pTVar1;
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_00;
  int64_t iVar2;
  TPZCompEl **ppTVar3;
  undefined4 in_EDX;
  _func_int **in_RSI;
  TPZSavable *in_RDI;
  TPZAdmChunkVector<TPZGraphEl_*,_10> *in_R9;
  TPZCompEl *ce;
  TPZAdmChunkVector<TPZCompEl_*,_10> *celvec;
  int64_t i;
  int64_t nel;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pTVar4;
  TPZAdmChunkVector<TPZGraphEl_*,_10> *this_01;
  undefined8 in_stack_ffffffffffffff68;
  int numberofchunks;
  TPZAdmChunkVector<TPZGraphEl_*,_10> *in_stack_ffffffffffffff70;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_02;
  long local_50;
  int in_stack_ffffffffffffffcc;
  
  numberofchunks = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_02531458);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZGraphMesh_025313c8;
  in_RDI[1]._vptr_TPZSavable = in_RSI;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *(undefined4 *)&in_RDI[9]._vptr_TPZSavable = in_EDX;
  TPZAdmChunkVector<TPZGraphEl_*,_10>::TPZAdmChunkVector(in_stack_ffffffffffffff70,numberofchunks);
  TPZAdmChunkVector<TPZGraphNode,_10>::TPZAdmChunkVector
            ((TPZAdmChunkVector<TPZGraphNode,_10> *)in_stack_ffffffffffffff70,numberofchunks);
  std::ofstream::ofstream(in_RDI + 0x51);
  pTVar4 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in_RDI + 0x91);
  std::__cxx11::string::string((string *)pTVar4);
  this_02 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 0x95);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
            (this_02,pTVar4);
  this_01 = (TPZAdmChunkVector<TPZGraphEl_*,_10> *)(in_RDI + 0x99);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
            (this_02,pTVar4);
  pTVar4 = (TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(in_RDI + 0x9d);
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TPZVec
            (pTVar4);
  TPZAdmChunkVector<TPZGraphEl_*,_10>::Resize(in_R9,in_stack_ffffffffffffffcc);
  TPZAdmChunkVector<TPZGraphEl_*,_10>::CompactDataStructure
            (this_01,(CompactScheme)((ulong)pTVar4 >> 0x20));
  TPZAdmChunkVector<TPZGraphNode,_10>::Resize
            ((TPZAdmChunkVector<TPZGraphNode,_10> *)in_R9,in_stack_ffffffffffffffcc);
  TPZAdmChunkVector<TPZGraphNode,_10>::CompactDataStructure
            ((TPZAdmChunkVector<TPZGraphNode,_10> *)this_01,(CompactScheme)((ulong)pTVar4 >> 0x20));
  this_00 = TPZCompMesh::ElementVec((TPZCompMesh *)in_RDI[1]._vptr_TPZSavable);
  iVar2 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                    (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>);
  for (local_50 = 0; local_50 < iVar2; local_50 = local_50 + 1) {
    ppTVar3 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)this_01,(int64_t)pTVar4);
    pTVar1 = *ppTVar3;
    if (pTVar1 != (TPZCompEl *)0x0) {
      (**(code **)(*(long *)pTVar1 + 0x148))(pTVar1,in_RDI,in_EDX);
    }
  }
  return;
}

Assistant:

TPZGraphMesh::TPZGraphMesh(TPZCompMesh *cm, int dimension, const std::set<int> & matids, const TPZVec<std::string> &scalarnames, const TPZVec<std::string> &vecnames) :
    fCompMesh(cm), fDimension(dimension), fMaterialIds(matids), fScalarNames(scalarnames), fVecNames(vecnames), fTensorNames()
{
	int64_t nel,i;
	fElementList.Resize(0);
	fElementList.CompactDataStructure(fElementList.NOW);
	fNodeMap.Resize(0);
	fNodeMap.CompactDataStructure(fNodeMap.NOW);
	
	TPZAdmChunkVector<TPZCompEl *> &celvec = fCompMesh->ElementVec();
	TPZCompEl *ce;
	nel = celvec.NElements();
	for(i=0;i<nel;i++) {
		ce = (TPZCompEl *) celvec[i];
		if(!ce) continue;
		ce->CreateGraphicalElement(*this, dimension);
	}
	
}